

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void show_seg_usage(void)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  uchar (*pauVar8) [8192];
  
  uVar6 = machine->ram_base;
  puts("segment usage:");
  putchar(10);
  if (max_bank != 0) {
    puts("\t\t\t\t    USED/FREE");
  }
  if (max_zp < 2) {
    puts("      ZP    -");
  }
  else {
    printf("      ZP    $%04X-$%04X  [%4i]     %4i/%4i\n",(ulong)uVar6,(ulong)((uVar6 + max_zp) - 1)
           ,(ulong)(uint)max_zp,(ulong)(uint)max_zp,(ulong)(0x100 - max_zp));
  }
  if (max_bss < 0x202) {
    puts("     BSS    -");
  }
  else {
    printf("     BSS    $%04X-$%04X  [%4i]     %4i/%4i\n\n");
  }
  pauVar8 = map;
  lVar5 = 0;
  uVar7 = 0;
  iVar1 = 0;
  iVar4 = 0;
  do {
    if ((long)max_bank < (long)uVar7) {
      uVar6 = iVar1 + 0x3ffU >> 10;
      puts("\t\t\t\t    ---- ----");
      printf("\t\t\t\t    %4iK%4iK\n",(ulong)uVar6,(ulong)(uint)(iVar4 >> 10));
      printf("\n\t\t\tTOTAL SIZE =     %4iK\n",(ulong)((iVar4 >> 10) + uVar6));
      return;
    }
    uVar6 = 0;
    for (lVar2 = 0; lVar2 != 0x2000; lVar2 = lVar2 + 1) {
      uVar6 = uVar6 + ((*pauVar8)[lVar2] != 0xff);
    }
    if (uVar6 == 0) {
      printf("BANK %2X  %-23s       0/8192\n",uVar7 & 0xffffffff,bank_name + uVar7);
    }
    else {
      printf("BANK %2X  %-23s    %4i/%4i\n",uVar7 & 0xffffffff,bank_name + uVar7,(ulong)uVar6,
             (ulong)(0x2000 - uVar6));
      if (dump_seg != 1) {
        lVar2 = 0;
        do {
          lVar3 = (long)(int)lVar2;
          lVar2 = lVar3 << 0x20;
          while( true ) {
            if (0x1fff < lVar3) goto LAB_0010e998;
            if (map[0][lVar3 + lVar5] != 0xff) break;
            lVar3 = lVar3 + 1;
            lVar2 = lVar2 + 0x100000000;
          }
          section = map[uVar7][lVar2 >> 0x20] & 0xf;
          page = (map[uVar7][lVar2 >> 0x20] & 0xffffffe0) * 0x100;
          for (lVar2 = lVar3; lVar2 < 0x2000; lVar2 = lVar2 + 1) {
            if ((byte)section != ((*pauVar8)[lVar2] & 0xf)) goto LAB_0010e94a;
          }
          lVar2 = 0x2000;
LAB_0010e94a:
          printf("    %s    $%04X-$%04X  [%4i]\n",section_name + (uint)section,
                 (ulong)(uint)(page + (int)lVar3),(ulong)((page + (int)lVar2) - 1),
                 (ulong)(uint)((int)lVar2 - (int)lVar3));
        } while( true );
      }
    }
LAB_0010e998:
    iVar1 = iVar1 + uVar6;
    iVar4 = iVar4 + (0x2000 - uVar6);
    uVar7 = uVar7 + 1;
    pauVar8 = pauVar8 + 1;
    lVar5 = lVar5 + 0x2000;
  } while( true );
}

Assistant:

void
show_seg_usage(void)
{
	int i, j;
	int addr, start, stop, nb;
	int rom_used;
	int rom_free;
	int ram_base = machine->ram_base;

	printf("segment usage:\n");
	printf("\n");

	if (max_bank)
		printf("\t\t\t\t    USED/FREE\n");

	/* zp usage */
	if (max_zp <= 1)
		printf("      ZP    -\n");
	else {
		start = ram_base;
		stop  = ram_base + (max_zp - 1);
		printf("      ZP    $%04X-$%04X  [%4i]     %4i/%4i\n", start, stop, stop - start + 1, stop-start+1, 256-(stop-start+1));
	}

	/* bss usage */
	if (max_bss <= 0x201)
		printf("     BSS    -\n");
	else {
		start = ram_base + 0x200;
		stop  = ram_base + (max_bss - 1);
		printf("     BSS    $%04X-$%04X  [%4i]     %4i/%4i\n\n", start, stop, stop - start + 1, stop-start+1, 8192-(stop-start+1));
	}

	/* bank usage */
	rom_used = 0;
	rom_free = 0;

	/* scan banks */
	for (i = 0; i <= max_bank; i++) {
		start = 0;
		addr = 0;
		nb = 0;

		/* count used and free bytes */
		for (j = 0; j < 8192; j++)
			if (map[i][j] != 0xFF)
				nb++;

		/* update used/free counters */
		rom_used += nb;
		rom_free += 8192 - nb;

		/* display bank infos */
		if (nb)
			printf("BANK %2X  %-23s    %4i/%4i\n",
					i, bank_name[i], nb, 8192 - nb);
		else {
			printf("BANK %2X  %-23s       0/8192\n", i, bank_name[i]);
			continue;
		}

		/* scan */
		if (dump_seg == 1)
			continue;

		for (;;) {
			/* search section start */
			for (; addr < 8192; addr++)
				if (map[i][addr] != 0xFF)
					break;

			/* check for end of bank */
			if (addr > 8191)
				break;

			/* get section type */
			section = map[i][addr] & 0x0F;
			page = (map[i][addr] & 0xE0) << 8;
			start = addr;

			/* search section end */
			for (; addr < 8192; addr++)
				if ((map[i][addr] & 0x0F) != section)
					break;

			/* display section infos */
			printf("    %s    $%04X-$%04X  [%4i]\n",
					section_name[section],	/* section name */
				    start + page,			/* starting address */
					addr  + page - 1,		/* end address */
					addr  - start);			/* size */
		}
	}

	/* total */
	rom_used = (rom_used + 1023) >> 10;
	rom_free = (rom_free) >> 10;
	printf("\t\t\t\t    ---- ----\n");
	printf("\t\t\t\t    %4iK%4iK\n", rom_used, rom_free);
	printf("\n\t\t\tTOTAL SIZE =     %4iK\n", (rom_used + rom_free));
}